

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joysticks.c
# Opt level: O3

void drop_callback(GLFWwindow *window,int count,char **paths)

{
  FILE *__stream;
  size_t __n;
  char *string;
  size_t sVar1;
  ulong uVar2;
  
  if (0 < count) {
    uVar2 = 0;
    do {
      __stream = fopen(paths[uVar2],"rb");
      if (__stream != (FILE *)0x0) {
        fseek(__stream,0,2);
        __n = ftell(__stream);
        fseek(__stream,0,0);
        string = (char *)malloc(__n + 1);
        string[__n] = '\0';
        sVar1 = fread(string,1,__n,__stream);
        if (sVar1 == __n) {
          glfwUpdateGamepadMappings(string);
        }
        free(string);
        fclose(__stream);
      }
      uVar2 = uVar2 + 1;
    } while ((uint)count != uVar2);
  }
  return;
}

Assistant:

static void drop_callback(GLFWwindow* window, int count, const char** paths)
{
    int i;

    for (i = 0;  i < count;  i++)
    {
        long size;
        char* text;
        FILE* stream = fopen(paths[i], "rb");
        if (!stream)
            continue;

        fseek(stream, 0, SEEK_END);
        size = ftell(stream);
        fseek(stream, 0, SEEK_SET);

        text = malloc(size + 1);
        text[size] = '\0';
        if (fread(text, 1, size, stream) == size)
            glfwUpdateGamepadMappings(text);

        free(text);
        fclose(stream);
    }
}